

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingFactored.cpp
# Opt level: O2

double __thiscall
ProblemFireFightingFactored::ComputeTransitionProb
          (ProblemFireFightingFactored *this,Index y,Index yVal,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Xs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *As,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys)

{
  pointer pSVar1;
  long lVar2;
  ulong uVar3;
  const_reference pvVar4;
  E *pEVar5;
  Index IVar6;
  uint uVar7;
  Index IVar8;
  uint uVar9;
  ulong __n;
  bool bVar10;
  double dVar11;
  double dVar12;
  allocator<char> local_a5;
  Index local_a4;
  long local_a0;
  ulong local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar3 = (ulong)y;
  if (*(ulong *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710 <= uVar3) {
    pEVar5 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar5,"position sfac transition probs NYI");
    __cxa_throw(pEVar5,&E::typeinfo,E::~E);
  }
  pSVar1 = (this->super_FactoredDecPOMDPDiscrete).
           super_MultiAgentDecisionProcessDiscreteFactoredStates._m_2dbn._m_XSoI_Y.
           super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar2 = *(long *)&pSVar1[uVar3].super_SDT.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  uVar3 = (long)*(pointer *)
                 ((long)&pSVar1[uVar3].super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8
                 ) - lVar2 >> 2;
  for (uVar9 = 0; (__n = (ulong)uVar9, *(Index *)(lVar2 + __n * 4) != y && (__n < uVar3));
      uVar9 = uVar9 + 1) {
  }
  local_a4 = yVal;
  if (uVar3 == __n) {
    pEVar5 = (E *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"did not find this house (hI=",&local_a5);
    StringTools::Append(&local_70,&local_90,y);
    std::operator+(&local_50,&local_70," in its own scope of influence XSoI)");
    E::E(pEVar5,&local_50);
    __cxa_throw(pEVar5,&E::typeinfo,E::~E);
  }
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(Xs,__n);
  local_98 = (ulong)*pvVar4;
  local_a0 = (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                    super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                    super_MultiAgentDecisionProcess + 800))(this,As,y);
  bVar10 = false;
  for (uVar7 = 0;
      (ulong)uVar7 <
      (ulong)((long)(Xs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(Xs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
    if (uVar9 != uVar7) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(Xs,(ulong)uVar7);
      if (*pvVar4 != 0) {
        bVar10 = true;
      }
    }
  }
  uVar3 = this->_m_nrFireLevels - 1;
  if (local_98 + 1 <= uVar3) {
    uVar3 = local_98 + 1;
  }
  IVar8 = (Index)local_98;
  IVar6 = IVar8 - 1;
  if (IVar8 == 0) {
    IVar6 = 0;
  }
  if (local_a0 == 0) {
    if (bVar10) {
      bVar10 = (Index)uVar3 == local_a4;
      dVar12 = (double)((ulong)(IVar8 == local_a4) * 0x3fc999999999999a);
      dVar11 = dVar12 + 0.8;
    }
    else {
      if (local_98 == 0) goto LAB_0044f117;
      bVar10 = (Index)uVar3 == local_a4;
      dVar12 = (double)((ulong)(IVar8 == local_a4) * 0x3fe3333333333333);
      dVar11 = dVar12 + 0.4;
    }
LAB_0044f10b:
    dVar11 = (double)((ulong)bVar10 * (long)dVar11 + (ulong)!bVar10 * (long)dVar12);
  }
  else {
    if (local_a0 == 1) {
      if (bVar10) {
        bVar10 = IVar6 == local_a4;
        dVar12 = (double)((ulong)(IVar8 == local_a4) * 0x3fd999999999999a);
        dVar11 = dVar12 + 0.6;
        goto LAB_0044f10b;
      }
      if (local_98 == 0) goto LAB_0044f117;
      bVar10 = IVar6 == local_a4;
    }
    else {
LAB_0044f117:
      bVar10 = local_a4 == 0;
    }
    dVar11 = (double)((ulong)bVar10 * 0x3ff0000000000000);
  }
  return dVar11;
}

Assistant:

double ProblemFireFightingFactored::ComputeTransitionProb(
            Index y,
            Index yVal,
            const std::vector< Index>& Xs,
            const std::vector< Index>& As,
            const std::vector< Index>& Ys
        ) const
{
    if(y >= _m_nrHouses)
        throw E("position sfac transition probs NYI");

    //this computes the probability P( nextLevel | ...) for hI
    Index hI = y;

    const Scope& XSoI = GetXSoI_Y(y);
    Index Index_of_hI_within_scope = 0;
    while(XSoI[Index_of_hI_within_scope] != hI &&
            Index_of_hI_within_scope < XSoI.size() )
        Index_of_hI_within_scope++;

    if(Index_of_hI_within_scope == XSoI.size())
        throw E( StringTools::Append("did not find this house (hI=",hI) +
                " in its own scope of influence XSoI)" );

    Index curLevel = Xs.at(Index_of_hI_within_scope);
    Index nextLevel = yVal;
    size_t nrAgentsAtLocation=GetNrAgentsAtHouse(As,hI);

#if 0 && DEBUG_CTM
    cout << "hI="<<hI<<" #agents="<<nrAgentsAtLocation << " ";
#endif
    bool neighborIsBurning = false;
    for(Index xI=0; xI < Xs.size(); xI++)
    {
        if(xI==Index_of_hI_within_scope)
            continue; //xI points not to a neighbor, but to this (hI) house
        if(Xs.at(xI) > 0)
            neighborIsBurning = true;
    }
    //bool neighborIsBurning = isNeighborBurning(s1, hI);

    Index sameLevel = curLevel;
    Index higherLevel = min((size_t)sameLevel+1, _m_nrFireLevels-1);
    Index lowerLevel = (curLevel==0) ? 0 : (curLevel-1);
    double p2=0.0;// the prob. factor of ThisHouseFirelevel;
    switch(nrAgentsAtLocation)
    {
        case(0): 
        {
            //this is kind of strange: when a house is not burning, but
            //its neigbhor is, it will increase its FL with p=0.8
            //but when it is already burning (and its neighbor is not), it 
            //increase with p=0.4...

            //fire is likely to increase
            if(neighborIsBurning)
            {
                if(nextLevel == sameLevel)
                    p2+=0.2;
                if(nextLevel == higherLevel)
                    p2+=0.8;
            }
            else if (curLevel == 0) //fire won't get ignited
            {
                if(0 == nextLevel)
                    p2=1.0;
                else //not possible so we can quit...
                    p2=0.0;
            }
            else //normal burning house
            {
                if(nextLevel == sameLevel)
                    p2+=0.6;
                if(nextLevel == higherLevel)
                    p2+=0.4;
            }
            break;
        }
        case(1): 
        {
            //fire is likely to decrease
            if(neighborIsBurning)
            {
                if(nextLevel == sameLevel)
                    p2+=0.4;
                if(nextLevel == lowerLevel) 
                    p2+=0.6; //.6 prob of extuinguishing 1 fl
            }
            else if (curLevel == 0) //fire won't get ignited
            {
                if(0 == nextLevel)
                    p2=1.0;
                else //not possible so we can quit...
                    p2=0.0;
            }
            else //normal burning house
            {
                if(nextLevel == sameLevel)
                    p2+=0.0;
                if(nextLevel == lowerLevel)
                    p2+=1.0;
            }
            break;
        }
        default: 
        {
#if 1
            //more than 1 agent: fire is extinguished
            if(0 == nextLevel)
                p2=1.0;
            else //not possible so we can quit...
                p2=0.0;
#else // made it depend on multipleAgentExtinguishProb
            if(0 == nextLevel)
                p2+=(GetMultipleAgentExtinguishProb());
            if(nextLevel == lowerLevel)
                p2+=(1-GetMultipleAgentExtinguishProb());
#endif
        }

        
    }
    return(p2);
}